

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O2

QVariant * __thiscall
QGenericUnixTheme::themeHint
          (QVariant *__return_storage_ptr__,QGenericUnixTheme *this,ThemeHint hint)

{
  QSize QVar1;
  int iVar2;
  QArrayDataPointer<QString> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(hint) {
  case SystemIconFallbackThemeName:
    local_58.d = (Data *)0x0;
    this_00 = &local_70;
    local_70.d = (Data *)0x0;
    local_70.ptr = (QString *)0x0;
    local_58.ptr = (QString *)0x617914;
    local_70.size = 0;
    local_58.size = 7;
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    goto LAB_00586b8f;
  case IconThemeSearchPaths:
    xdgIconThemePaths();
    goto LAB_00586b3a;
  case StyleNames:
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = (QString *)0x6177b8;
    local_88.size = 0;
    local_70.size = 6;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    local_a0.d = (Data *)0x0;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_a0.ptr = L"Windows";
    local_b8.size = 0;
    local_a0.size = 7;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
LAB_00586b3a:
    ::QVariant::QVariant(__return_storage_ptr__,(QList_conflict1 *)&local_58);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    goto LAB_00586b94;
  case WindowAutoPlacement:
  case DialogButtonBoxLayout:
  case UseFullScreenForPopupMenu:
switchD_00586981_caseD_12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QPlatformTheme::themeHint(__return_storage_ptr__,&this->super_QPlatformTheme,hint);
      return __return_storage_ptr__;
    }
    break;
  case DialogButtonBoxButtonsHaveIcons:
switchD_00586981_caseD_14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      ::QVariant::QVariant(__return_storage_ptr__,true);
      return __return_storage_ptr__;
    }
    break;
  case KeyboardScheme:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar2 = 2;
LAB_00586b26:
      ::QVariant::QVariant(__return_storage_ptr__,iVar2);
      return __return_storage_ptr__;
    }
    break;
  case UiEffects:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar2 = 0x80;
      goto LAB_00586b26;
    }
    break;
  default:
    if (hint == IconFallbackSearchPaths) {
      iconFallbackPaths();
      goto LAB_00586b3a;
    }
    if (hint != MouseCursorTheme) {
      if (hint == MouseCursorSize) {
        QVar1 = mouseCursorSize();
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          ::QVariant::QVariant(__return_storage_ptr__,QVar1);
          return __return_storage_ptr__;
        }
        break;
      }
      if (hint == PreferFileIconFromTheme) goto switchD_00586981_caseD_14;
      goto switchD_00586981_caseD_12;
    }
    this_00 = &local_58;
    mouseCursorTheme();
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)this_00);
LAB_00586b8f:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
LAB_00586b94:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericUnixTheme::themeHint(ThemeHint hint) const
{
    switch (hint) {
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QString(QStringLiteral("hicolor")));
    case QPlatformTheme::IconThemeSearchPaths:
        return xdgIconThemePaths();
    case QPlatformTheme::IconFallbackSearchPaths:
        return iconFallbackPaths();
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(true);
    case QPlatformTheme::StyleNames: {
        QStringList styleNames;
        styleNames << QStringLiteral("Fusion") << QStringLiteral("Windows");
        return QVariant(styleNames);
    }
    case QPlatformTheme::KeyboardScheme:
        return QVariant(int(X11KeyboardScheme));
    case QPlatformTheme::UiEffects:
        return QVariant(int(HoverEffect));
    case QPlatformTheme::MouseCursorTheme:
        return QVariant(mouseCursorTheme());
    case QPlatformTheme::MouseCursorSize:
        return QVariant(mouseCursorSize());
    case QPlatformTheme::PreferFileIconFromTheme:
        return true;
    default:
        break;
    }
    return QPlatformTheme::themeHint(hint);
}